

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O2

int SUNQRAdd_ICWY_SB(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  uint uVar1;
  realtype *c;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  int iVar7;
  realtype rVar8;
  double dVar9;
  
  N_VScale(1.0,df,*QRdata);
  if (0 < m) {
    uVar1 = m - 1;
    iVar7 = uVar1 * mMax;
    lVar2 = (long)iVar7 * 8;
    N_VDotProdMultiLocal(m,Q[uVar1],Q,(realtype *)(*(long *)((long)QRdata + 0x10) + lVar2));
    uVar6 = (ulong)(uint)m;
    N_VDotProdMultiLocal
              (m,*QRdata,Q,(realtype *)(*(long *)((long)QRdata + 0x10) + lVar2 + uVar6 * 8));
    N_VDotProdMultiAllReduce(m * 2,*QRdata,(realtype *)(lVar2 + *(long *)((long)QRdata + 0x10)));
    lVar2 = *(long *)((long)QRdata + 0x10);
    c = R + mMax * m;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      c[uVar3] = *(realtype *)((long)(iVar7 + m) * 8 + lVar2 + uVar3 * 8);
    }
    lVar2 = *(long *)((long)QRdata + 0x10);
    *(undefined8 *)(lVar2 + (long)(int)(iVar7 + uVar1) * 8) = 0x3ff0000000000000;
    iVar7 = 1;
    for (uVar3 = 0; uVar3 != uVar6; uVar3 = uVar3 + 1) {
      uVar4 = (ulong)iVar7;
      pdVar5 = (double *)((long)mMax * 8 * uVar4 + lVar2);
      for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        c[uVar4] = c[uVar4] - c[uVar3] * *pdVar5;
        pdVar5 = pdVar5 + mMax;
      }
      iVar7 = iVar7 + 1;
      lVar2 = lVar2 + 8;
    }
    N_VLinearCombination(m,c,Q,*(N_Vector *)((long)QRdata + 8));
    N_VLinearSum(1.0,*QRdata,-1.0,*(N_Vector *)((long)QRdata + 8),*QRdata);
  }
  rVar8 = N_VDotProd(*QRdata,*QRdata);
  dVar9 = 0.0;
  if (0.0 < rVar8) {
    rVar8 = N_VDotProd(*QRdata,*QRdata);
    if (rVar8 < 0.0) {
      dVar9 = sqrt(rVar8);
    }
    else {
      dVar9 = SQRT(rVar8);
    }
  }
  R[(mMax + 1) * m] = dVar9;
  N_VScale(1.0 / dVar9,*QRdata,Q[m]);
  return 0;
}

Assistant:

int SUNQRAdd_ICWY_SB(N_Vector *Q, realtype *R, N_Vector df,
                     int m, int mMax, void *QRdata)
{
    sunindextype j, k;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* stores d_fi in temp */

    if (m > 0) {
      /* T(1:k-1,k-1)^T = Q(:,1:k-1)^T * Q(:,k-1) */
      N_VDotProdMultiLocal(m, Q[m-1], Q, qrdata->temp_array + (m-1) * mMax);

      /* R(1:k-1,k) = Q_k-1^T * df */
      /* Put R values at end of temp_array */
      N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array + (m-1) * mMax + m );
      N_VDotProdMultiAllReduce(m+m, qrdata->vtemp, qrdata->temp_array + (m-1) * mMax);

      /* Move the last values from temp array into R */
      for (k = 0; k < m; k++) {
        R[m*mMax + k] = qrdata->temp_array[(m-1)*mMax + m + k];
      }

      /* T(k-1,k-1) = 1.0 */
      qrdata->temp_array[(m-1) * mMax + (m-1)] = ONE;

      /* Solve T^T * R(1:k-1,k) = R(1:k-1,k) */
      for (k = 0; k < m; k++) {
        /* Skip setting the diagonal element because it doesn't change */
        for (j = k+1; j < m; j++) {
          R[m * mMax + j] -= R[m * mMax + k] * qrdata->temp_array[j * mMax + k];
        }
      }
      /* end */

      /* Q(:,k-1) = df - Q_k-1 R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / \| df \| */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}